

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_blurshader.cpp
# Opt level: O2

void __thiscall
FBlurShader::ComputeBlurSamples
          (FBlurShader *this,int sampleCount,float blurAmount,TArray<float,_float> *sampleWeights,
          TArray<int,_int> *sampleOffsets)

{
  float *pfVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  
  TArray<float,_float>::Resize(sampleWeights,sampleCount);
  TArray<int,_int>::Resize(sampleOffsets,sampleCount);
  auVar9 = rsqrtss(in_XMM1,ZEXT416((uint)(blurAmount * 6.2831855)));
  fVar7 = auVar9._0_4_;
  fVar7 = fVar7 * -0.5 * (blurAmount * 6.2831855 * fVar7 * fVar7 + -3.0);
  pfVar1 = sampleWeights->Array;
  *pfVar1 = fVar7;
  piVar2 = sampleOffsets->Array;
  *piVar2 = 0;
  uVar4 = (long)sampleCount / 2 & 0xffffffff;
  if ((int)((long)sampleCount / 2) < 1) {
    uVar4 = 0;
  }
  iVar5 = -1;
  uVar3 = 0;
  fVar8 = fVar7;
  while (uVar4 != uVar3) {
    fVar6 = (float)(int)uVar3 + 1.0;
    fVar6 = expf(fVar6 * fVar6 * -0.5 * (1.0 / (blurAmount * blurAmount)));
    fVar6 = fVar6 * fVar7;
    pfVar1[uVar3 * 2 + 1] = fVar6;
    pfVar1[uVar3 * 2 + 2] = fVar6;
    piVar2[uVar3 * 2 + 1] = (int)(uVar3 + 1);
    piVar2[uVar3 * 2 + 2] = iVar5;
    fVar8 = fVar8 + fVar6 + fVar6;
    iVar5 = iVar5 + -1;
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  uVar4 = (ulong)(uint)sampleCount;
  if (sampleCount < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pfVar1[uVar3] = pfVar1[uVar3] * (1.0 / fVar8);
  }
  return;
}

Assistant:

void FBlurShader::ComputeBlurSamples(int sampleCount, float blurAmount, TArray<float> &sampleWeights, TArray<int> &sampleOffsets)
{
	sampleWeights.Resize(sampleCount);
	sampleOffsets.Resize(sampleCount);

	sampleWeights[0] = ComputeGaussian(0, blurAmount);
	sampleOffsets[0] = 0;

	float totalWeights = sampleWeights[0];

	for (int i = 0; i < sampleCount / 2; i++)
	{
		float weight = ComputeGaussian(i + 1.0f, blurAmount);

		sampleWeights[i * 2 + 1] = weight;
		sampleWeights[i * 2 + 2] = weight;
		sampleOffsets[i * 2 + 1] = i + 1;
		sampleOffsets[i * 2 + 2] = -i - 1;

		totalWeights += weight * 2;
	}

	for (int i = 0; i < sampleCount; i++)
	{
		sampleWeights[i] /= totalWeights;
	}
}